

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

tuple<long,_long> calcSum<short>(TWaveformViewT<short> *waveform)

{
  short sVar1;
  _Head_base<0UL,_long,_false> _Var2;
  long *in_RSI;
  short *psVar3;
  long lVar4;
  tuple<long,_long> tVar5;
  
  if (in_RSI[1] < 1) {
    _Var2._M_head_impl = 0;
    psVar3 = (short *)0x0;
  }
  else {
    lVar4 = 0;
    psVar3 = (short *)0x0;
    _Var2._M_head_impl = 0;
    do {
      sVar1 = *(short *)(*in_RSI + lVar4 * 2);
      _Var2._M_head_impl = _Var2._M_head_impl + sVar1;
      psVar3 = (short *)((long)psVar3 + (ulong)(uint)((int)sVar1 * (int)sVar1));
      lVar4 = lVar4 + 1;
    } while (in_RSI[1] != lVar4);
  }
  waveform->samples = psVar3;
  waveform->n = _Var2._M_head_impl;
  tVar5.super__Tuple_impl<0UL,_long,_long>.super__Head_base<0UL,_long,_false>._M_head_impl =
       _Var2._M_head_impl;
  tVar5.super__Tuple_impl<0UL,_long,_long>.super__Tuple_impl<1UL,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl =
       (_Head_base<1UL,_long,_false>)(_Head_base<1UL,_long,_false>)waveform;
  return (tuple<long,_long>)tVar5.super__Tuple_impl<0UL,_long,_long>;
}

Assistant:

std::tuple<int64_t, int64_t> calcSum(const TWaveformViewT<T> & waveform) {
    int64_t sum = 0;
    int64_t sum2 = 0;

    auto samples = waveform.samples;
    auto n       = waveform.n;

    for (int is = 0; is < n; ++is) {
        int32_t a0 = samples[is];
        sum += a0;
        sum2 += a0*a0;
    }

    return std::tuple<int64_t, int64_t>(sum, sum2);
}